

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::LogToSinks
               (LogSeverity severity,char *full_filename,char *base_filename,int line,
               LogMessageTime *logmsgtime,char *message,size_t message_len)

{
  bool bVar1;
  pointer this;
  type this_00;
  reference ppLVar2;
  size_type local_58;
  size_t i;
  shared_lock<std::shared_mutex> l;
  char *message_local;
  LogMessageTime *logmsgtime_local;
  int line_local;
  char *base_filename_local;
  char *full_filename_local;
  LogSeverity severity_local;
  
  l._8_8_ = message;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)&i,(mutex_type *)sink_mutex_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&sinks_);
  if (bVar1) {
    this = std::
           unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
           ::operator->((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                         *)&sinks_);
    local_58 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::size(this);
    while (local_58 != 0) {
      this_00 = std::
                unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                ::operator*((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                             *)&sinks_);
      ppLVar2 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::operator[]
                          (this_00,local_58 - 1);
      (*(*ppLVar2)->_vptr_LogSink[2])
                (*ppLVar2,(ulong)severity,full_filename,base_filename,(ulong)(uint)line,logmsgtime,
                 l._8_8_,message_len);
      local_58 = local_58 - 1;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)&i);
  return;
}

Assistant:

inline void LogDestination::LogToSinks(LogSeverity severity,
                                       const char* full_filename,
                                       const char* base_filename, int line,
                                       const LogMessageTime& logmsgtime,
                                       const char* message,
                                       size_t message_len) {
  std::shared_lock<SinkMutex> l{sink_mutex_};
  if (sinks_) {
    for (size_t i = sinks_->size(); i-- > 0;) {
      (*sinks_)[i]->send(severity, full_filename, base_filename, line,
                         logmsgtime, message, message_len);
    }
  }
}